

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::happens_after
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *identifier)

{
  ThreadState *thr;
  iterator it;
  void *local_88;
  iterator local_80;
  iterator local_50;
  
  local_88 = identifier;
  std::__shared_mutex_pthread::lock(&(this->g_lock)._M_impl);
  phmap::container_internal::
  parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
  ::find<void*>(&local_80,&this->happens_states,&local_88);
  if (local_80.inner_ == (Inner *)0x0) {
    create_happens(&local_50,this,local_88);
  }
  else {
    VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
              ((VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)tls,
               (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)
               ((long)local_80.it_.field_1.slot_ + 8));
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->g_lock);
  return;
}

Assistant:

void happens_after(tls_t tls, void* identifier) final {
    {
      std::lock_guard<LockT> exLockT(g_lock);
      auto it = happens_states.find(identifier);
      if (it == happens_states.end()) {
        create_happens(identifier);
        return;  // create -> no happens_before can be synced
      } else {
        ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
        // update vector clock of thread with happened before clocks
        thr->update(it->second);
      }
    }
  }